

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall
helics::Federate::updateSimulationTime(Federate *this,Time newTime,Time oldTime,bool iterating)

{
  (this->mCurrentTime).internalTimeCode = newTime.internalTimeCode;
  if ((this->timeUpdateCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::operator()
              (&this->timeUpdateCallback,
               (TimeRepresentation<count_time<9,_long>_>)newTime.internalTimeCode,iterating);
  }
  (*this->_vptr_Federate[10])(this,newTime.internalTimeCode,oldTime.internalTimeCode);
  if (newTime.internalTimeCode == 0x7fffffffffffffff) {
    updateFederateMode(this,FINISHED);
    return;
  }
  return;
}

Assistant:

void Federate::updateSimulationTime(Time newTime, Time oldTime, bool iterating)
{
    mCurrentTime = newTime;
    if (timeUpdateCallback) {
        timeUpdateCallback(newTime, iterating);
    }
    updateTime(newTime, oldTime);
    if (newTime == Time::maxVal()) {
        updateFederateMode(Modes::FINISHED);
    }
}